

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O3

exr_result_t exr_set_dwa_compression_level(exr_context_t ctxt,int part_index,float level)

{
  pthread_mutex_t *__mutex;
  exr_result_t eVar1;
  exr_context_t nonc;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar1;
    }
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->standard_error)(ctxt,8);
      return eVar1;
    }
    if ((level < 0.0) || (6.5504e+09 < level)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->report_error)(ctxt,3,"Invalid dwa quality level specified");
      return eVar1;
    }
    ctxt->parts[(uint)part_index]->dwa_compression_level = level;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_set_dwa_compression_level (exr_context_t ctxt, int part_index, float level)
{
    exr_result_t rv;
    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    // avoid bad math (fp exceptions or whatever) by clamping here
    // there has always been a clamp to 0, but on the upper end, there
    // is a limit too, where you only get black images anyway, so that
    // is not particularly useful, not that any large value will
    // really be crushing the image
    if (level >= 0.f && level <= (65504.f*100000.f))
    {
        part->dwa_compression_level = level;
        rv                          = EXR_ERR_SUCCESS;
    }
    else
    {
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid dwa quality level specified"));
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}